

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

Vec_Wec_t * Gia_MiniAigSuperGates(Mini_Aig_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vMap;
  int *__s;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  iVar1 = Mini_AigPoNum(p);
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar2,0x10);
  }
  pVVar3->pArray = pVVar4;
  pVVar3->nSize = iVar1;
  iVar2 = p->nSize;
  uVar5 = iVar2 / 2;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar6 = uVar5;
  }
  vMap->nCap = uVar6;
  if (uVar6 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = uVar5;
  }
  else {
    __s = (int *)malloc((long)(int)uVar6 << 2);
    vMap->pArray = __s;
    vMap->nSize = uVar5;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)(int)uVar5 << 2);
      goto LAB_0078a777;
    }
  }
  __s = (int *)0x0;
LAB_0078a777:
  iVar8 = 0;
  if (3 < iVar2) {
    iVar8 = 0;
    uVar7 = 1;
    do {
      iVar2 = Mini_AigNodeIsPi(p,(int)uVar7);
      if (iVar2 != 0) {
        if (uVar5 <= uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar7] = iVar8;
        iVar8 = iVar8 + 1;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)(p->nSize / 2));
  }
  iVar2 = Mini_AigPiNum(p);
  if (iVar8 != iVar2) {
    __assert_fail("Index == Mini_AigPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                  ,0x342,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
  }
  uVar6 = 0;
  if (3 < p->nSize) {
    uVar6 = 0;
    iVar2 = 1;
    do {
      iVar8 = Mini_AigNodeIsPo(p,iVar2);
      if (iVar8 != 0) {
        uVar5 = Mini_AigNodeFanin0(p,iVar2);
        if ((int)uVar5 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar5 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(iFan0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                        ,0x347,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
        }
        if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar7 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        Gia_MiniAigSuperGates_rec(p,uVar5 >> 1,pVVar4 + uVar7,vMap);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->nSize / 2);
  }
  uVar5 = Mini_AigPoNum(p);
  if (uVar6 == uVar5) {
    if (vMap->pArray != (int *)0x0) {
      free(vMap->pArray);
    }
    free(vMap);
    return pVVar3;
  }
  __assert_fail("Index == Mini_AigPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                ,0x34a,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
}

Assistant:

Vec_Wec_t * Gia_MiniAigSuperGates( Mini_Aig_t * p )
{
    Vec_Wec_t * vRes = Vec_WecStart( Mini_AigPoNum(p) );
    Vec_Int_t * vMap = Vec_IntStartFull( Mini_AigNodeNum(p) );
    int i, Index = 0;
    Mini_AigForEachPi( p, i )
        Vec_IntWriteEntry( vMap, i, Index++ );
    assert( Index == Mini_AigPiNum(p) );
    Index = 0;
    Mini_AigForEachPo( p, i )
    {
        int iFan0 = Mini_AigNodeFanin0( p, i );
        assert( !Abc_LitIsCompl(iFan0) );
        Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), Vec_WecEntry(vRes, Index++), vMap );
    }
    assert( Index == Mini_AigPoNum(p) );
    Vec_IntFree( vMap );
    return vRes;
}